

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_stream.c
# Opt level: O1

int asterism_stream_read(asterism_stream_s *stream)

{
  int err;
  char *pcVar1;
  
  err = uv_read_start((uv_stream_t *)&stream->socket,stream_read_alloc_cb,stream_read_cb);
  if (err != 0) {
    pcVar1 = uv_strerror(err);
    _asterism_log(ASTERISM_LOG_DEBUG,
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_stream.c(315)"
                  ,"%s",pcVar1);
  }
  return err;
}

Assistant:

int asterism_stream_read(
    struct asterism_stream_s *stream)
{
    int ret = uv_read_start((uv_stream_t *)&stream->socket, stream_read_alloc_cb, stream_read_cb);
    if (ret != 0)
    {
        asterism_log(ASTERISM_LOG_DEBUG, "%s", uv_strerror(ret));
        goto cleanup;
    }
cleanup:
    return ret;
}